

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTree::insertItem(QGraphicsSceneBspTree *this,QGraphicsItem *item,QRectF *rect)

{
  long in_FS_OFFSET;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  climbTree<QGraphicsSceneBspTree::insertItem(QGraphicsItem*,QRectF_const&)::__0>
            (this,(anon_class_8_1_898d2811 *)item,rect,(int)((ulong)lVar1 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::insertItem(QGraphicsItem *item, const QRectF &rect)
{
    climbTree([item](QList<QGraphicsItem *> *items){
        items->prepend(item);
    }, rect);
}